

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSBuilder::freeTemp(Wasm2JSBuilder *this,Type type,IString temp)

{
  iterator __position;
  vector<wasm::IString,std::allocator<wasm::IString>> *this_00;
  key_type local_20;
  Type type_local;
  IString temp_local;
  
  type_local.id = temp.str._M_len;
  local_20.id = type.id;
  if ((type.id & 1) == 0 || type.id < 7) {
    this_00 = (vector<wasm::IString,std::allocator<wasm::IString>> *)
              std::__detail::
              _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->frees,&local_20);
    __position._M_current = *(IString **)(this_00 + 8);
    if (__position._M_current == *(IString **)(this_00 + 0x10)) {
      std::vector<wasm::IString,std::allocator<wasm::IString>>::
      _M_realloc_insert<wasm::IString_const&>(this_00,__position,(IString *)&type_local);
    }
    else {
      ((__position._M_current)->str)._M_len = type_local.id;
      ((__position._M_current)->str)._M_str = temp.str._M_str;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
    }
    return;
  }
  __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                ,0xe8,"void wasm::Wasm2JSBuilder::freeTemp(Type, IString)");
}

Assistant:

void freeTemp(Type type, IString temp) {
    // TODO: handle tuples
    assert(!type.isTuple() && "Unexpected tuple type");
    frees[type].push_back(temp);
  }